

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
ColumnSampler<double>::leave_m_cols
          (ColumnSampler<double> *this,size_t m,Xoshiro256PP *rnd_generator)

{
  long lVar1;
  pointer pdVar2;
  pointer puVar3;
  unsigned_long uVar4;
  pointer pdVar5;
  result_type rVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t lev;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  result_type_conflict1 rVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> curr_weights;
  _Vector_base<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> *local_50;
  size_t local_48;
  uniform_real_distribution<double> local_40;
  
  if ((m != 0) && (uVar7 = this->n_cols, m < uVar7)) {
    if ((this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (uVar7 >> 2 < m) {
        auVar14._8_4_ = (int)(m >> 0x20);
        auVar14._0_8_ = m;
        auVar14._12_4_ = 0x45300000;
        auVar15._8_4_ = (int)(uVar7 >> 0x20);
        auVar15._0_8_ = uVar7;
        auVar15._12_4_ = 0x45300000;
        uVar10 = uVar7;
        if (((auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 0.75 <=
            (auVar14._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)m) - 4503599627370496.0)) {
          while( true ) {
            local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar10 - 1);
            this->curr_pos = (size_t)local_68._M_impl.super__Vector_impl_data._M_finish;
            if (local_68._M_impl.super__Vector_impl_data._M_finish <= (pointer)(uVar7 - m)) break;
            local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                              ((uniform_int_distribution<unsigned_long> *)&local_68,rnd_generator);
            puVar3 = (this->col_indices).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar9 = this->curr_pos;
            uVar4 = puVar3[rVar6];
            puVar3[rVar6] = puVar3[sVar9];
            puVar3[sVar9] = uVar4;
            uVar7 = this->n_cols;
            uVar10 = this->curr_pos;
          }
        }
        else {
          std::
          shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Xoshiro::Xoshiro256PP&>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(this->col_indices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(this->col_indices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,rnd_generator);
        }
        this->curr_pos = m;
      }
      else {
        uVar7 = 0;
        while (this->curr_pos = uVar7, uVar7 < m) {
          local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)(~uVar7 + this->n_cols);
          local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                            ((uniform_int_distribution<unsigned_long> *)&local_68,rnd_generator);
          puVar3 = (this->col_indices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + this->curr_pos;
          uVar4 = puVar3[rVar6];
          puVar3[rVar6] = *puVar3;
          *puVar3 = uVar4;
          uVar7 = this->curr_pos + 1;
        }
      }
    }
    else {
      local_50 = &this->tree_weights;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_68,local_50);
      pdVar2 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar5 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
        *pdVar5 = 0.0;
      }
      sVar9 = 0;
      while (sVar9 != m) {
        dVar12 = *local_68._M_impl.super__Vector_impl_data._M_start;
        if (dVar12 <= 0.0) {
          m = sVar9;
          if (sVar9 == 0) {
            drop_weights(this);
            goto LAB_00157825;
          }
          break;
        }
        uVar7 = 0;
        local_48 = sVar9;
        for (uVar10 = 0; uVar8 = this->tree_levels, uVar10 < uVar8; uVar10 = uVar10 + 1) {
          local_40._M_param._M_a = 0.0;
          local_40._M_param._M_b = dVar12;
          rVar13 = std::uniform_real_distribution<double>::operator()(&local_40,rnd_generator);
          uVar7 = (uVar7 * 2 + 2) -
                  (ulong)(rVar13 < local_68._M_impl.super__Vector_impl_data._M_start[uVar7 * 2 + 1])
          ;
          dVar12 = local_68._M_impl.super__Vector_impl_data._M_start[uVar7];
        }
        (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar7] = dVar12;
        local_68._M_impl.super__Vector_impl_data._M_start[uVar7] = 0.0;
        while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
          lVar1 = uVar7 * 8;
          uVar7 = uVar7 - 1 >> 1;
          uVar10 = lVar1 - 8U | 8;
          local_68._M_impl.super__Vector_impl_data._M_start[uVar7] =
               *(double *)((long)local_68._M_impl.super__Vector_impl_data._M_start + uVar10) +
               *(double *)((long)local_68._M_impl.super__Vector_impl_data._M_start + uVar10 + 8);
        }
        sVar9 = local_48 + 1;
      }
      pdVar5 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar7 = ((long)(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) - 2;
          uVar7 != 0xffffffffffffffff; uVar7 = uVar7 - 1) {
        *(double *)((long)pdVar5 + (uVar7 & 0xfffffffffffffffe) * 4) =
             pdVar5[uVar7 + 1] + *(double *)((long)pdVar5 + (uVar7 & 0xfffffffffffffffe) * 4);
      }
      this->n_dropped = this->n_cols - m;
LAB_00157825:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
    }
  }
  return;
}

Assistant:

void ColumnSampler<ldouble_safe>::leave_m_cols(size_t m, RNG_engine &rnd_generator)
{
    if (m == 0 || m >= this->n_cols)
        return;

    if (!this->has_weights())
    {
        size_t chosen;
        if (m <= this->n_cols / 4)
        {
            for (this->curr_pos = 0; this->curr_pos < m; this->curr_pos++)
            {
                chosen = std::uniform_int_distribution<size_t>(0, this->n_cols - this->curr_pos - 1)(rnd_generator);
                std::swap(this->col_indices[this->curr_pos + chosen], this->col_indices[this->curr_pos]);
            }
        }

        else if ((ldouble_safe)m >= (ldouble_safe)(3./4.) * (ldouble_safe)this->n_cols)
        {
            for (this->curr_pos = this->n_cols-1; this->curr_pos > this->n_cols - m; this->curr_pos--)
            {
                chosen = std::uniform_int_distribution<size_t>(0, this->curr_pos)(rnd_generator);
                std::swap(this->col_indices[chosen], this->col_indices[this->curr_pos]);
            }
            this->curr_pos = m;
        }

        else
        {
            std::shuffle(this->col_indices.begin(), this->col_indices.end(), rnd_generator);
            this->curr_pos = m;
        }
    }

    else
    {
        std::vector<double> curr_weights = this->tree_weights;
        std::fill(this->tree_weights.begin(), this->tree_weights.end(), 0.);
        double rnd_subrange, w_left;
        double curr_subrange;
        size_t curr_ix;

        for (size_t col = 0; col < m; col++)
        {
            curr_ix = 0;
            curr_subrange = curr_weights[0];
            if (curr_subrange <= 0)
            {
                if (col == 0)
                {
                    this->drop_weights();
                    return;
                }

                else
                {
                    m = col;
                    goto rebuild_tree;
                }
            }

            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = curr_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = curr_weights[curr_ix];
            }

            this->tree_weights[curr_ix] = curr_weights[curr_ix];

            /* now remove the weight of the chosen element */
            curr_weights[curr_ix] = 0;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                curr_weights[curr_ix] =   curr_weights[ix_child(curr_ix)]
                                        + curr_weights[ix_child(curr_ix) + 1];
            }
        }

        /* rebuild the tree after getting new weights */
        rebuild_tree:
        for (size_t ix = this->tree_weights.size() - 1; ix > 0; ix--)
            this->tree_weights[ix_parent(ix)] += this->tree_weights[ix];

        this->n_dropped = this->n_cols - m;
    }
}